

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_scanDecl(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  uint local_4c;
  uint local_44;
  uint local_34;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 2) {
    enc_local._4_4_ = -1;
  }
  else {
    if (ptr[1] == '\0') {
      local_34 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    }
    else {
      local_34 = unicode_byte_type(ptr[1],*ptr);
    }
    switch(local_34) {
    case 0x14:
      *nextTokPtr = ptr + 2;
      enc_local._4_4_ = 0x21;
      break;
    default:
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0;
      break;
    case 0x16:
    case 0x18:
      for (end_local = ptr + 2; 1 < (long)end - (long)end_local; end_local = end_local + 2) {
        if (end_local[1] == '\0') {
          local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
        }
        else {
          local_44 = unicode_byte_type(end_local[1],*end_local);
        }
        if ((local_44 - 9 < 2) || (local_44 == 0x15)) {
LAB_00a2cb81:
          *nextTokPtr = end_local;
          return 0x10;
        }
        if ((local_44 != 0x16) && (local_44 != 0x18)) {
          if (local_44 != 0x1e) {
            *nextTokPtr = end_local;
            return 0;
          }
          if ((long)end - (long)end_local < 4) {
            return -1;
          }
          if (end_local[3] == '\0') {
            local_4c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[2]);
          }
          else {
            local_4c = unicode_byte_type(end_local[3],end_local[2]);
          }
          if (((local_4c - 9 < 2) || (local_4c == 0x15)) || (local_4c == 0x1e)) {
            *nextTokPtr = end_local;
            return 0;
          }
          goto LAB_00a2cb81;
        }
      }
      enc_local._4_4_ = -1;
      break;
    case 0x1b:
      enc_local._4_4_ = little2_scanComment(enc,ptr + 2,end,nextTokPtr);
    }
  }
  return enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(scanDecl)(const ENCODING *enc, const char *ptr,
                 const char *end, const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_MINUS:
    return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COND_SECT_OPEN;
  case BT_NMSTRT:
  case BT_HEX:
    ptr += MINBPC(enc);
    break;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_PERCNT:
      REQUIRE_CHARS(enc, ptr, end, 2);
      /* don't allow <!ENTITY% foo "whatever"> */
      switch (BYTE_TYPE(enc, ptr + MINBPC(enc))) {
      case BT_S: case BT_CR: case BT_LF: case BT_PERCNT:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* fall through */
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DECL_OPEN;
    case BT_NMSTRT:
    case BT_HEX:
      ptr += MINBPC(enc);
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}